

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::MmapInputFile::MmapInputFile(MmapInputFile *this,string_view filename,string_view data)

{
  string_view filename_00;
  InputFile *in_RCX;
  char *in_RSI;
  undefined8 *in_RDI;
  size_t in_R8;
  
  filename_00._M_str = in_RSI;
  filename_00._M_len = in_R8;
  InputFile::InputFile(in_RCX,filename_00);
  *in_RDI = &PTR_TryOpen_008887d0;
  in_RDI[5] = in_RCX;
  in_RDI[6] = in_R8;
  return;
}

Assistant:

MmapInputFile::MmapInputFile(string_view filename, string_view data)
    : InputFile(filename) {
  data_ = data;
}